

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
Utf8Decode_UnexpectedContinuationBytes_Test::TestBody
          (Utf8Decode_UnexpectedContinuationBytes_Test *this)

{
  bytes *input;
  bytes *input_00;
  bytes *input_01;
  bytes *input_02;
  bytes *input_03;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  allocator_type local_c5;
  undefined4 local_c4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  cpstring local_a8;
  cpstring local_88;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_c4._0_1_ = 0x80;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,__l,&local_c5);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_28,&local_c0,input);
  std::__cxx11::u32string::~u32string((u32string *)&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  local_c4 = CONCAT31(local_c4._1_3_,0xbf);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,__l_00,&local_c5);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_48,&local_c0,input_00);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  local_c4._0_2_ = 0xbf80;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,__l_01,&local_c5);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_68,&local_c0,input_01);
  std::__cxx11::u32string::~u32string((u32string *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  local_c4 = CONCAT13(local_c4._3_1_,0x80bf80);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,__l_02,&local_c5);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_88,&local_c0,input_02);
  std::__cxx11::u32string::~u32string((u32string *)&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  local_c4 = 0xbf80bf80;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,__l_03,&local_c5);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_a8,&local_c0,input_03);
  std::__cxx11::u32string::~u32string((u32string *)&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  return;
}

Assistant:

TEST_F (Utf8Decode, UnexpectedContinuationBytes) {
    decode_bad (bytes ({0x80}));                   // first continuation byte
    decode_bad (bytes ({0xbf}));                   // last continuation byte
    decode_bad (bytes ({0x80, 0xbf}));             // 2 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80}));       // 3 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80, 0xbf})); // 4 continuation bytes
}